

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O2

void duckdb::RadixSort(BufferManager *buffer_manager,data_ptr_t *dataptr,idx_t *count,
                      idx_t *col_offset,idx_t *sorting_size,SortLayout *sort_layout,
                      bool contains_string)

{
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> uVar1;
  data_ptr_t orig_ptr;
  int iVar2;
  undefined4 extraout_var;
  data_ptr_t temp_ptr;
  ulong uVar4;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> pre_allocated_array;
  PDQIterator result;
  BufferHandle temp_block;
  ulong uVar3;
  
  if (contains_string) {
    uVar1._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)*dataptr;
    pre_allocated_array.super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
    _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)
         (unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)
         uVar1._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t
         .super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    duckdb_pdqsort::PDQConstants::PDQConstants
              ((PDQConstants *)&temp_block,sort_layout->entry_size,*col_offset,*sorting_size,
               (data_ptr_t)
               (*count * sort_layout->entry_size +
               (long)uVar1._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl));
    result.ptr = (data_ptr_t)
                 (sort_layout->entry_size * *count +
                 (long)uVar1._M_t.
                       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
    result.entry_size = &sort_layout->entry_size;
    duckdb_pdqsort::pdqsort_branchless
              ((PDQIterator *)&pre_allocated_array,&result,(PDQConstants *)&temp_block);
    duckdb_pdqsort::PDQConstants::~PDQConstants((PDQConstants *)&temp_block);
  }
  else if (*count < 0x19) {
    temp_block.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    InsertionSort(*dataptr,(data_ptr_t)0x0,count,col_offset,&sort_layout->entry_size,sorting_size,
                  (idx_t *)&temp_block,false);
  }
  else {
    if (*sorting_size < 5) {
      RadixSortLSD(buffer_manager,dataptr,count,col_offset,&sort_layout->entry_size,sorting_size);
      return;
    }
    iVar2 = (*buffer_manager->_vptr_BufferManager[0xf])(buffer_manager);
    uVar3 = CONCAT44(extraout_var,iVar2);
    uVar4 = sort_layout->entry_size * *count;
    if (uVar4 < uVar3 || uVar4 - uVar3 == 0) {
      uVar4 = uVar3;
    }
    (*buffer_manager->_vptr_BufferManager[4])(&temp_block,buffer_manager,4,uVar4,1);
    make_unsafe_uniq_array_uninitialized<unsigned_long>
              ((duckdb *)&pre_allocated_array,*sorting_size * 0x101);
    orig_ptr = *dataptr;
    temp_ptr = BufferHandle::Ptr(&temp_block);
    result.ptr = (data_ptr_t)0x0;
    RadixSortMSD(orig_ptr,temp_ptr,count,col_offset,&sort_layout->entry_size,sorting_size,
                 (idx_t *)&result,
                 (idx_t *)pre_allocated_array.
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,false);
    ::std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
              (&pre_allocated_array.
                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>);
    BufferHandle::~BufferHandle(&temp_block);
  }
  return;
}

Assistant:

void RadixSort(BufferManager &buffer_manager, const data_ptr_t &dataptr, const idx_t &count, const idx_t &col_offset,
               const idx_t &sorting_size, const SortLayout &sort_layout, bool contains_string) {

	if (contains_string) {
		auto begin = duckdb_pdqsort::PDQIterator(dataptr, sort_layout.entry_size);
		auto end = begin + count;
		duckdb_pdqsort::PDQConstants constants(sort_layout.entry_size, col_offset, sorting_size, *end);
		return duckdb_pdqsort::pdqsort_branchless(begin, begin + count, constants);
	}

	if (count <= SortConstants::INSERTION_SORT_THRESHOLD) {
		return InsertionSort(dataptr, nullptr, count, col_offset, sort_layout.entry_size, sorting_size, 0, false);
	}

	if (sorting_size <= SortConstants::MSD_RADIX_SORT_SIZE_THRESHOLD) {
		return RadixSortLSD(buffer_manager, dataptr, count, col_offset, sort_layout.entry_size, sorting_size);
	}

	const auto block_size = buffer_manager.GetBlockSize();
	auto temp_block =
	    buffer_manager.Allocate(MemoryTag::ORDER_BY, MaxValue(count * sort_layout.entry_size, block_size));
	auto pre_allocated_array =
	    make_unsafe_uniq_array_uninitialized<idx_t>(sorting_size * SortConstants::MSD_RADIX_LOCATIONS);
	RadixSortMSD(dataptr, temp_block.Ptr(), count, col_offset, sort_layout.entry_size, sorting_size, 0,
	             pre_allocated_array.get(), false);
}